

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

int CVmBifTADS::re_match
              (re_pattern_buffer *__buffer,char *__string,int __length,int __start,
              re_registers *__regs)

{
  vm_globalvar_t *pvVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_val_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint uVar7;
  ushort *puVar8;
  size_t sVar9;
  int32_t iVar10;
  uint argc;
  ulong bytecnt;
  CVmObjPageEntry *pCVar11;
  utf8_ptr local_48;
  size_t len;
  ushort *local_38;
  
  argc = (uint)__buffer;
  CVmBif::check_argc_range(argc,2,3);
  pvVar5 = sp_;
  pvVar3 = sp_ + -2;
  uVar4 = *(undefined4 *)&sp_[-2].field_0x4;
  aVar2 = sp_[-2].val;
  sp_ = sp_ + 1;
  pvVar5->typ = pvVar3->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar2;
  pvVar3 = sp_;
  uVar4 = *(undefined4 *)&pvVar5[-1].field_0x4;
  aVar2 = pvVar5[-1].val;
  sp_ = sp_ + 1;
  pvVar3->typ = pvVar5[-1].typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar4;
  pvVar3->val = aVar2;
  if (argc < 3) {
    iVar10 = 1;
  }
  else {
    if (pvVar5[-3].typ != VM_INT) {
      err_throw(0x900);
    }
    iVar10 = pvVar5[-3].val.intval;
  }
  pvVar1 = G_bif_tads_globals_X->last_rex_str;
  uVar4 = *(undefined4 *)&pvVar5[-2].field_0x4;
  aVar2 = pvVar5[-2].val;
  (pvVar1->val).typ = pvVar5[-2].typ;
  *(undefined4 *)&(pvVar1->val).field_0x4 = uVar4;
  (pvVar1->val).val = aVar2;
  CRegexSearcherSimple::clear_group_regs(G_bif_tads_globals_X->rex_searcher);
  if (sp_[-1].typ == VM_OBJ) {
    iVar6 = CVmObjPattern::is_pattern_obj(sp_[-1].val.obj);
    if (iVar6 != 0) {
      pCVar11 = G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff);
      local_38 = (ushort *)0x0;
      sp_ = sp_ + -1;
      goto LAB_00253a10;
    }
  }
  pCVar11 = (CVmObjPageEntry *)0x0;
  local_38 = (ushort *)CVmBif::pop_str_val();
LAB_00253a10:
  puVar8 = (ushort *)CVmBif::pop_str_val();
  bytecnt = (ulong)*puVar8;
  puVar8 = puVar8 + 1;
  local_48.p_ = (char *)puVar8;
  len = bytecnt;
  if (iVar10 < 0) {
    sVar9 = utf8_ptr::s_len((char *)puVar8,bytecnt);
    iVar6 = (int)sVar9;
  }
  else {
    iVar6 = -1;
  }
  iVar6 = iVar6 + iVar10;
  while ((0 < iVar6 && (bytecnt != 0))) {
    iVar6 = iVar6 + -1;
    utf8_ptr::inc(&local_48,&len);
    bytecnt = len;
  }
  if (pCVar11 == (CVmObjPageEntry *)0x0) {
    uVar7 = CRegexSearcherSimple::compile_and_match
                      (G_bif_tads_globals_X->rex_searcher,(char *)(local_38 + 1),(ulong)*local_38,
                       (char *)puVar8,local_48.p_,bytecnt);
  }
  else {
    uVar7 = CRegexSearcherSimple::match_pattern
                      (G_bif_tads_globals_X->rex_searcher,
                       (re_compiled_pattern *)**(undefined8 **)((long)&pCVar11->ptr_ + 8),
                       (char *)puVar8,local_48.p_,bytecnt);
  }
  if ((int)uVar7 < 0) {
    CVmBif::retval_nil();
  }
  else {
    sVar9 = utf8_ptr::s_len(local_48.p_,(ulong)uVar7);
    CVmBif::retval_int(sVar9);
  }
  sp_ = sp_ + -(long)(int)argc;
  return argc * 0x10;
}

Assistant:

void CVmBifTADS::re_match(VMG_ uint argc)
{
    const char *str;
    utf8_ptr p;
    size_t len;
    int match_len;
    vm_val_t *v1, *v2, *v3;
    int start_idx;
    CVmObjPattern *pat_obj = 0;
    const char *pat_str = 0;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    v1 = G_stk->get(0);
    v2 = G_stk->get(1);
    v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    start_idx = 1;
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and reset any
     *   old group registers (since they'd point into the previous string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* 
     *   check what we have for the pattern - we could have either a string
     *   giving the regular expression, or a RexPattern object with the
     *   compiled pattern 
     */
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to match */
    str = pop_str_val(vmg0_);
    len = vmb_get_len(str);
    p.set((char *)str + VMB_LEN);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) : -1);

    /* skip to the starting index */
    for ( ; start_idx > 0 && len != 0 ; --start_idx, p.inc(&len)) ;

    /* match the pattern */
    if (pat_obj != 0)
    {
        /* match the compiled pattern object */
        match_len = G_bif_tads_globals->rex_searcher->
                    match_pattern(pat_obj->get_pattern(vmg0_),
                                  str + VMB_LEN, p.getptr(), len);
    }
    else
    {
        /* match the pattern to the regular expression string */
        match_len = G_bif_tads_globals->rex_searcher->
                    compile_and_match(pat_str + VMB_LEN, vmb_get_len(pat_str),
                                      str + VMB_LEN, p.getptr(), len);
    }

    /* check for a match */
    if (match_len >= 0)
    {
        /* we got a match - calculate the character length of the match */
        retval_int(vmg_ (long)p.len(match_len));
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}